

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

LinkageStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::linkShaders
          (LinkageStatus *__return_storage_ptr__,Program *this,CompilationStatus *vertex_shader,
          CompilationStatus *fragment_shader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transform_feedback_varyings)

{
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  char *__s;
  GLchar *log;
  GLchar *pGStack_60;
  GLint log_size;
  GLchar *varying;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  iterator i;
  allocator<char> local_32;
  undefined1 local_31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *transform_feedback_varyings_local;
  CompilationStatus *fragment_shader_local;
  CompilationStatus *vertex_shader_local;
  Program *this_local;
  LinkageStatus *program;
  
  local_31 = 0;
  __return_storage_ptr__->program_id = 0;
  __return_storage_ptr__->program_linkage_status = 0;
  local_30 = transform_feedback_varyings;
  transform_feedback_varyings_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)fragment_shader;
  fragment_shader_local = vertex_shader;
  vertex_shader_local = &this->m_vertex_shader_status;
  this_local = (Program *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->program_linkage_log,"",&local_32);
  std::allocator<char>::~allocator(&local_32);
  if ((fragment_shader_local->shader_id != 0) &&
     (*(int *)&(transform_feedback_varyings_local->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start != 0)) {
    GVar2 = (*this->m_gl->createProgram)();
    __return_storage_ptr__->program_id = GVar2;
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x54f);
    if (__return_storage_ptr__->program_id != 0) {
      local_50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_30);
      while( true ) {
        varying = (GLchar *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(local_30);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&varying);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_50);
        pGStack_60 = (GLchar *)std::__cxx11::string::c_str();
        (*this->m_gl->transformFeedbackVaryings)
                  (__return_storage_ptr__->program_id,1,&stack0xffffffffffffffa0,0x8c8c);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glTransformFeedbackVaryings() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x55b);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
      (*this->m_gl->attachShader)
                (__return_storage_ptr__->program_id,fragment_shader_local->shader_id);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x561);
      (*this->m_gl->attachShader)
                (__return_storage_ptr__->program_id,
                 *(GLuint *)
                  &(transform_feedback_varyings_local->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glAttachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x565);
      (*this->m_gl->linkProgram)(__return_storage_ptr__->program_id);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x569);
      (*this->m_gl->getProgramiv)
                (__return_storage_ptr__->program_id,0x8b82,
                 &__return_storage_ptr__->program_linkage_status);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x56e);
      if (__return_storage_ptr__->program_linkage_status == 0) {
        log._4_4_ = 0;
        (*this->m_gl->getProgramiv)
                  (__return_storage_ptr__->program_id,0x8b84,(GLint *)((long)&log + 4));
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x577);
        if ((log._4_4_ != 0) && (__s = (char *)operator_new__((long)log._4_4_), __s != (char *)0x0))
        {
          memset(__s,0,(long)log._4_4_);
          (*this->m_gl->getProgramInfoLog)
                    (__return_storage_ptr__->program_id,log._4_4_,(GLsizei *)0x0,__s);
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->program_linkage_log,__s);
          if (__s != (char *)0x0) {
            operator_delete__(__s);
          }
          GVar3 = (*this->m_gl->getError)();
          glu::checkError(GVar3,"glGetProgramInfoLog() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                          ,0x587);
        }
      }
      (*this->m_gl->detachShader)
                (__return_storage_ptr__->program_id,fragment_shader_local->shader_id);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x58f);
      (*this->m_gl->detachShader)
                (__return_storage_ptr__->program_id,
                 *(GLuint *)
                  &(transform_feedback_varyings_local->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glDetachShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x593);
      if (__return_storage_ptr__->program_linkage_status == 0) {
        (*this->m_gl->deleteProgram)(__return_storage_ptr__->program_id);
        __return_storage_ptr__->program_id = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::LinkageStatus gl3cts::ClipDistance::Utility::Program::linkShaders(
	const CompilationStatus& vertex_shader, const CompilationStatus& fragment_shader,
	std::vector<std::string>& transform_feedback_varyings)
{
	LinkageStatus program = { 0, GL_NONE, "" };

	if (vertex_shader.shader_id && fragment_shader.shader_id)
	{
		try
		{
			/* Creation */
			program.program_id = m_gl.createProgram();

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			if (program.program_id)
			{
				/* Transform Feedback setup */
				for (std::vector<std::string>::iterator i = transform_feedback_varyings.begin();
					 i != transform_feedback_varyings.end(); ++i)
				{
					const glw::GLchar* varying = i->c_str();

					m_gl.transformFeedbackVaryings(program.program_id, 1, &varying, GL_INTERLEAVED_ATTRIBS);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTransformFeedbackVaryings() call failed.");
				}

				/* Linking */
				m_gl.attachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.attachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glAttachShader() call failed.");

				m_gl.linkProgram(program.program_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glLinkProgram() call failed.");

				/* Status query */
				m_gl.getProgramiv(program.program_id, GL_LINK_STATUS, &program.program_linkage_status);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

				/* Logging */
				if (program.program_linkage_status == GL_FALSE)
				{
					glw::GLint log_size = 0;

					m_gl.getProgramiv(program.program_id, GL_INFO_LOG_LENGTH, &log_size);

					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramiv() call failed.");

					if (log_size)
					{
						glw::GLchar* log = new glw::GLchar[log_size];

						if (log)
						{
							memset(log, 0, log_size);

							m_gl.getProgramInfoLog(program.program_id, log_size, DE_NULL, log);

							program.program_linkage_log = log;

							delete[] log;

							GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetProgramInfoLog() call failed.");
						}
					}
				}

				/* Cleanup */
				m_gl.detachShader(program.program_id, vertex_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				m_gl.detachShader(program.program_id, fragment_shader.shader_id);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDetachShader() call failed.");

				if (program.program_linkage_status == GL_FALSE)
				{
					m_gl.deleteProgram(program.program_id);

					program.program_id = 0;
				}
			}
		}
		catch (...)
		{
			if (program.program_id)
			{
				m_gl.deleteProgram(program.program_id);

				program.program_id = 0;
			}
		}
	}

	return program;
}